

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O0

void quicksort<server::crcinfo,bool(*)(server::crcinfo_const&,server::crcinfo_const&)>
               (crcinfo *start,crcinfo *end,_func_bool_crcinfo_ptr_crcinfo_ptr *fun)

{
  undefined1 auVar1 [16];
  bool bVar2;
  crcinfo *pcVar3;
  crcinfo local_40;
  crcinfo pivot;
  crcinfo *j;
  crcinfo *i;
  crcinfo *mid;
  _func_bool_crcinfo_ptr_crcinfo_ptr *fun_local;
  crcinfo *end_local;
  crcinfo *start_local;
  
  fun_local = (_func_bool_crcinfo_ptr_crcinfo_ptr *)end;
  end_local = start;
  do {
    if ((long)fun_local - (long)end_local >> 3 < 0xb) {
      insertionsort<server::crcinfo,bool(*)(server::crcinfo_const&,server::crcinfo_const&)>
                (end_local,(crcinfo *)fun_local,fun);
      return;
    }
    auVar1._8_8_ = (long)fun_local - (long)end_local >> 0x3f;
    auVar1._0_8_ = (long)fun_local - (long)end_local >> 3;
    pcVar3 = end_local + SUB168(auVar1 / SEXT816(2),0);
    j = end_local + 1;
    pivot = (crcinfo)((long)fun_local + -0x10);
    server::crcinfo::crcinfo(&local_40);
    bVar2 = (*fun)(end_local,pcVar3);
    if (bVar2) {
      bVar2 = (*fun)((crcinfo *)(fun_local + -8),end_local);
      if (bVar2) {
        local_40 = *end_local;
        *end_local = *(crcinfo *)(fun_local + -8);
        *(crcinfo *)(fun_local + -8) = *pcVar3;
      }
      else {
        bVar2 = (*fun)((crcinfo *)(fun_local + -8),pcVar3);
        if (bVar2) {
          local_40 = *(crcinfo *)(fun_local + -8);
          *(crcinfo *)(fun_local + -8) = *pcVar3;
        }
        else {
          local_40 = *pcVar3;
        }
      }
    }
    else {
      bVar2 = (*fun)(end_local,(crcinfo *)(fun_local + -8));
      if (bVar2) {
        local_40 = *end_local;
        *end_local = *pcVar3;
      }
      else {
        bVar2 = (*fun)(pcVar3,(crcinfo *)(fun_local + -8));
        if (bVar2) {
          local_40 = *(crcinfo *)(fun_local + -8);
          *(crcinfo *)(fun_local + -8) = *end_local;
          *end_local = *pcVar3;
        }
        else {
          local_40 = *pcVar3;
          swap<server::crcinfo>(end_local,(crcinfo *)(fun_local + -8));
        }
      }
    }
    *pcVar3 = *(crcinfo *)(fun_local + -0x10);
    do {
      while (bVar2 = (*fun)(j,&local_40), !bVar2) {
        while( true ) {
          pivot = (crcinfo)((long)pivot + -8);
          bVar2 = (*fun)(&local_40,(crcinfo *)pivot);
          if (!bVar2) break;
          if ((ulong)pivot <= j) goto LAB_001671a0;
        }
        swap<server::crcinfo>(j,(crcinfo *)pivot);
        j = j + 1;
        if ((ulong)pivot <= j) goto LAB_001671a0;
      }
      j = j + 1;
    } while (j < (ulong)pivot);
LAB_001671a0:
    *(crcinfo *)(fun_local + -0x10) = *j;
    *j = local_40;
    if ((long)j - (long)end_local >> 3 < (long)fun_local - (long)(j + 1) >> 3) {
      quicksort<server::crcinfo,bool(*)(server::crcinfo_const&,server::crcinfo_const&)>
                (end_local,j,fun);
      end_local = j + 1;
    }
    else {
      quicksort<server::crcinfo,bool(*)(server::crcinfo_const&,server::crcinfo_const&)>
                (j + 1,(crcinfo *)fun_local,fun);
      fun_local = (_func_bool_crcinfo_ptr_crcinfo_ptr *)j;
    }
  } while( true );
}

Assistant:

static inline void quicksort(T *start, T *end, F fun)
{
    while(end-start > 10)
    {
        T *mid = &start[(end-start)/2], *i = start+1, *j = end-2, pivot;
        if(fun(*start, *mid)) /* start < mid */
        {
            if(fun(end[-1], *start)) { pivot = *start; *start = end[-1]; end[-1] = *mid; } /* end < start < mid */
            else if(fun(end[-1], *mid)) { pivot = end[-1]; end[-1] = *mid; } /* start <= end < mid */
            else { pivot = *mid; } /* start < mid <= end */
        }
        else if(fun(*start, end[-1])) { pivot = *start; *start = *mid; } /*mid <= start < end */
        else if(fun(*mid, end[-1])) { pivot = end[-1]; end[-1] = *start; *start = *mid; } /* mid < end <= start */
        else { pivot = *mid; swap(*start, end[-1]); }  /* end <= mid <= start */
        *mid = end[-2];
        do
        {
            while(fun(*i, pivot)) if(++i >= j) goto partitioned;
            while(fun(pivot, *--j)) if(i >= j) goto partitioned;
            swap(*i, *j);
        }
        while(++i < j);
    partitioned:
        end[-2] = *i;
        *i = pivot;
        
        if(i-start < end-(i+1))
        {
            quicksort(start, i, fun);
            start = i+1;
        }
        else
        {
            quicksort(i+1, end, fun);
            end = i;
        }
    }
    
    insertionsort(start, end, fun);
}